

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

Aig_Man_t * Saig_ManUnrollCOI(Aig_Man_t *pAig,int nFrames)

{
  char *pcVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  undefined1 auVar4 [16];
  int iVar5;
  Aig_Obj_t **ppAVar6;
  Aig_Man_t *p;
  char *pcVar7;
  Aig_Obj_t *pAVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  Aig_Obj_t *p1;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  long lVar20;
  
  sVar16 = (long)pAig->vObjs->nSize * (long)nFrames;
  ppAVar6 = (Aig_Obj_t **)calloc(sVar16,8);
  p = Aig_ManStart((int)sVar16);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar16 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar16 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pName = pcVar7;
  pcVar1 = pAig->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar16 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar16 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pSpec = pcVar7;
  auVar4 = _DAT_008403e0;
  if (0 < nFrames) {
    iVar5 = pAig->pConst1->Id * nFrames;
    pAVar8 = p->pConst1;
    lVar14 = (ulong)(uint)nFrames - 1;
    auVar18._8_4_ = (int)lVar14;
    auVar18._0_8_ = lVar14;
    auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
    lVar14 = 0;
    auVar18 = auVar18 ^ _DAT_008403e0;
    auVar19 = _DAT_008403d0;
    do {
      auVar21 = auVar19 ^ auVar4;
      if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                  auVar18._4_4_ < auVar21._4_4_) & 1)) {
        *(Aig_Obj_t **)((long)ppAVar6 + lVar14 + (long)iVar5 * 8) = pAVar8;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        *(Aig_Obj_t **)((long)ppAVar6 + lVar14 + (long)iVar5 * 8 + 8) = pAVar8;
      }
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar20 + 2;
      lVar14 = lVar14 + 0x10;
    } while ((ulong)(nFrames + 1U >> 1) << 4 != lVar14);
    if (0 < nFrames) {
      iVar5 = pAig->nRegs;
      iVar11 = pAig->nObjs[2];
      iVar15 = 0;
      do {
        if (iVar5 < iVar11) {
          lVar14 = 0;
          do {
            if (pAig->vCis->nSize <= lVar14) goto LAB_00651db1;
            pvVar2 = pAig->vCis->pArray[lVar14];
            pAVar8 = Aig_ObjCreateCi(p);
            ppAVar6[*(int *)((long)pvVar2 + 0x24) * nFrames + iVar15] = pAVar8;
            lVar14 = lVar14 + 1;
            iVar5 = pAig->nRegs;
            iVar11 = pAig->nObjs[2];
          } while (lVar14 < iVar11 - iVar5);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != nFrames);
      goto LAB_00651b0a;
    }
  }
  iVar5 = pAig->nRegs;
  iVar11 = pAig->nObjs[2];
LAB_00651b0a:
  uVar12 = iVar11 - iVar5;
  pVVar9 = pAig->vCis;
  if ((int)uVar12 < pVVar9->nSize) {
    uVar17 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) goto LAB_00651db1;
      pvVar2 = pVVar9->pArray[uVar17];
      pAVar8 = Aig_ObjCreateCi(p);
      ppAVar6[(long)*(int *)((long)pvVar2 + 0x24) * (long)nFrames] = pAVar8;
      uVar17 = uVar17 + 1;
      pVVar9 = pAig->vCis;
    } while ((int)uVar17 < pVVar9->nSize);
  }
  if (nFrames < 1) {
    iVar5 = pAig->nRegs;
  }
  else {
    pVVar9 = pAig->vObjs;
    iVar11 = 0;
    do {
      if (0 < pVVar9->nSize) {
        lVar14 = 0;
        do {
          pvVar2 = pVVar9->pArray[lVar14];
          if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
            uVar17 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              pAVar8 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar8 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                       (ulong)ppAVar6[*(int *)(uVar17 + 0x24) * nFrames + iVar11]);
            }
            uVar17 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                   (ulong)ppAVar6[*(int *)(uVar17 + 0x24) * nFrames + iVar11]);
            }
            pAVar8 = Aig_And(p,pAVar8,p1);
            ppAVar6[*(int *)((long)pvVar2 + 0x24) * nFrames + iVar11] = pAVar8;
            pVVar9 = pAig->vObjs;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < pVVar9->nSize);
      }
      iVar5 = pAig->nRegs;
      lVar14 = (long)iVar5;
      if (0 < lVar14) {
        pVVar3 = pAig->vCos;
        uVar17 = (ulong)(uint)(pAig->nObjs[3] - iVar5);
        iVar15 = -iVar5;
        do {
          if (((((int)uVar17 < 0) || (pVVar3->nSize <= (int)uVar17)) ||
              (uVar12 = pAig->nObjs[2] + iVar15, (int)uVar12 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar12)) goto LAB_00651db1;
          uVar10 = *(ulong *)((long)pVVar3->pArray[uVar17] + 8);
          uVar13 = uVar10 & 0xfffffffffffffffe;
          if (uVar13 == 0) {
            pAVar8 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar8 = (Aig_Obj_t *)
                     ((ulong)((uint)uVar10 & 1) ^
                     (ulong)ppAVar6[*(int *)(uVar13 + 0x24) * nFrames + iVar11]);
          }
          if (iVar11 < nFrames + -1) {
            ppAVar6[*(int *)((long)pAig->vCis->pArray[uVar12] + 0x24) * nFrames + iVar11 + 1] =
                 pAVar8;
          }
          uVar17 = uVar17 + 1;
          iVar15 = iVar15 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFrames);
  }
  if (iVar5 < pAig->nObjs[3]) {
    lVar14 = 0;
    do {
      if (pAig->vCos->nSize <= lVar14) {
LAB_00651db1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCos->pArray[lVar14];
      uVar17 = *(ulong *)((long)pvVar2 + 8);
      uVar10 = uVar17 & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar8 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar8 = (Aig_Obj_t *)
                 ((ulong)((uint)uVar17 & 1) ^
                 (ulong)ppAVar6[*(int *)(uVar10 + 0x24) * nFrames + nFrames + -1]);
      }
      pAVar8 = Aig_ObjCreateCo(p,pAVar8);
      ppAVar6[*(int *)((long)pvVar2 + 0x24) * nFrames + nFrames + -1] = pAVar8;
      lVar14 = lVar14 + 1;
    } while (lVar14 < (long)pAig->nObjs[3] - (long)pAig->nRegs);
  }
  if (pAig->pObjCopies != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pObjCopies == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x1e0,"Aig_Man_t *Saig_ManUnrollCOI(Aig_Man_t *, int)");
  }
  pAig->pObjCopies = ppAVar6;
  return p;
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;
    // create mapping for the frames nodes
    pObjMap = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    // create the only output
    for ( f = nFrames-1; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    // created lots of dangling nodes - no sweeping!
    //Aig_ManCleanup( pFrames );
    assert( pAig->pObjCopies == NULL );
    pAig->pObjCopies = pObjMap;
    return pFrames;
}